

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# z80.cpp
# Opt level: O0

void translate_instruction
               (vector<z80,_std::allocator<z80>_> *instructions,OpCode op,Operand *o1,Operand *o2)

{
  vector<z80,_std::allocator<z80>_> *pvVar1;
  vector<z80,std::allocator<z80>> *pvVar2;
  bool bVar3;
  undefined4 extraout_XMM0_Da;
  undefined4 extraout_XMM0_Db;
  bool local_2b2a;
  bool local_2a52;
  OpCode local_29f4 [3];
  Operand local_29e8;
  Operand local_29c0;
  z80 local_2998;
  Operand local_28f8;
  Operand local_28d0;
  Operand local_28a8;
  z80 local_2880;
  Operand local_27e0;
  Operand local_27b8;
  Operand local_2790;
  Operand local_2768;
  z80 local_2740;
  Operand local_26a0;
  allocator<char> local_2671;
  string local_2670;
  Operand local_2650;
  OpCode local_2624;
  Operand local_2620;
  OpCode local_25f4;
  Operand local_25f0;
  Operand local_25c8;
  OpCode local_25a0;
  allocator<char> local_2599;
  string local_2598;
  Operand local_2578;
  Operand local_2550;
  Operand local_2528;
  Operand local_2500;
  Operand local_24d8;
  OpCode local_24ac;
  Operand local_24a8;
  Operand local_2480;
  OpCode local_2454;
  Operand local_2450;
  Operand local_2428;
  Operand local_2400;
  Operand local_23d8;
  z80 local_23b0;
  Operand local_2310;
  Operand local_22e8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_22c0;
  Operand local_22a0;
  Operand local_2278;
  Operand local_2250;
  z80 local_2228;
  Operand local_2188;
  Operand local_2160;
  Operand local_2138;
  Operand local_2110;
  Operand local_20e8;
  Operand local_20c0;
  Operand local_2098;
  Operand local_2070;
  Operand local_2048;
  Operand local_2020;
  z80 local_1ff8;
  Operand local_1f58;
  Operand local_1f30;
  z80 local_1f08;
  Operand local_1e68;
  Operand local_1e40;
  z80 local_1e18;
  Operand local_1d78;
  Operand local_1d50;
  string local_1d28;
  Operand local_1d08;
  Operand local_1ce0;
  z80 local_1cb8;
  Operand local_1c18;
  Operand local_1bf0;
  Operand local_1bc8;
  Operand local_1ba0;
  Operand local_1b78;
  Operand local_1b50;
  z80 local_1b28;
  Operand local_1a88;
  Operand local_1a60;
  z80 local_1a38;
  Operand local_1998;
  Operand local_1970;
  z80 local_1948;
  Operand local_18a8;
  Operand local_1880;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1858;
  Operand local_1838;
  Operand local_1810;
  z80 local_17e8;
  Operand local_1748;
  Operand local_1720;
  Operand local_16f8;
  Operand local_16d0;
  allocator<char> local_16a1;
  string local_16a0;
  Operand local_1680;
  z80 local_1658;
  Operand local_15b8;
  Operand local_1590;
  z80 local_1568;
  Operand local_14c8;
  Operand local_1498;
  Operand local_1470;
  z80 local_1448;
  Operand local_13a8;
  Operand local_1380;
  z80 local_1358;
  Operand local_12b8;
  Operand local_1290;
  Operand local_1268;
  z80 local_1240;
  Operand local_11a0;
  Operand local_1178;
  Operand local_1150;
  z80 local_1128;
  Operand local_1088;
  Operand local_1060;
  z80 local_1038;
  Operand local_f98;
  Operand local_f68;
  Operand local_f40;
  z80 local_f18;
  byte local_e72;
  byte local_e71;
  Operand local_e70;
  Operand local_e48;
  byte local_e1a;
  byte local_e19;
  Operand local_e18;
  Operand local_df0;
  Operand local_dc8;
  Operand local_da0;
  Operand local_d78;
  Operand local_d50;
  z80 local_d28;
  Operand local_c88;
  Operand local_c60;
  z80 local_c38;
  Operand local_b98;
  Operand local_b70;
  Operand local_b48;
  Operand local_b20;
  z80 local_af8;
  Operand local_a58;
  Operand local_a30;
  z80 local_a08;
  Operand local_968;
  Operand local_940;
  z80 local_918;
  Operand local_878;
  Operand local_850;
  z80 local_828;
  Operand local_788;
  Operand local_758;
  z80 local_730;
  Operand local_690;
  Operand local_668;
  Operand local_640;
  z80 local_618;
  Operand local_578;
  Operand local_548;
  Operand local_520;
  z80 local_4f8;
  byte local_452;
  byte local_451;
  Operand local_450;
  Operand local_428;
  byte local_3fa;
  byte local_3f9;
  Operand local_3f8;
  Operand local_3d0;
  Operand local_3a8;
  Operand local_380;
  Operand local_358;
  Operand local_330;
  z80 local_308;
  Operand local_268;
  Operand local_240;
  z80 local_218;
  Operand local_178;
  Operand local_150;
  z80 local_128;
  Operand local_78;
  Operand local_50;
  Operand *local_28;
  Operand *o2_local;
  Operand *o1_local;
  vector<z80,std::allocator<z80>> *pvStack_10;
  OpCode op_local;
  vector<z80,_std::allocator<z80>_> *instructions_local;
  
  local_28 = o2;
  o2_local = o1;
  o1_local._4_4_ = op;
  pvStack_10 = (vector<z80,std::allocator<z80>> *)instructions;
  switch(op) {
  case hlt:
    local_29f4[1] = 1;
    std::vector<z80,_std::allocator<z80>_>::emplace_back<z80::OpCode>(instructions,local_29f4 + 1);
    break;
  default:
    local_29f4[0] = unknown;
    std::vector<z80,_std::allocator<z80>_>::emplace_back<z80::OpCode>(instructions,local_29f4);
    break;
  case movzwl:
    local_2454 = ld;
    Operand::Operand(&local_24a8,o1);
    translateLiteral(&local_2480,&local_24a8);
    std::vector<z80,std::allocator<z80>>::emplace_back<z80::OpCode,Operand&,Operand>
              ((vector<z80,std::allocator<z80>> *)instructions,&local_2454,&registers.iy,&local_2480
              );
    Operand::~Operand(&local_2480);
    Operand::~Operand(&local_24a8);
    break;
  case xorl:
    Operand::Operand(&local_20e8,o2);
    translateRegister(&local_20c0,&local_20e8);
    bVar3 = Operand::operator!=(&local_20c0,&registers.a);
    Operand::~Operand(&local_20c0);
    Operand::~Operand(&local_20e8);
    pvVar1 = (vector<z80,_std::allocator<z80>_> *)pvStack_10;
    if (bVar3) {
      Operand::Operand(&local_2138,o2);
      translateRegister(&local_2110,&local_2138);
      Operand::Operand(&local_2188,o1);
      translateRegister(&local_2160,&local_2188);
      bVar3 = Operand::operator==(&local_2110,&local_2160);
      Operand::~Operand(&local_2160);
      Operand::~Operand(&local_2188);
      Operand::~Operand(&local_2110);
      Operand::~Operand(&local_2138);
      pvVar1 = (vector<z80,_std::allocator<z80>_> *)pvStack_10;
      if (bVar3) {
        Operand::Operand(&local_2278,o1);
        translateRegister(&local_2250,&local_2278);
        literal(&local_22a0,0);
        z80::z80(&local_2228,ld,&local_2250,&local_22a0);
        std::vector<z80,_std::allocator<z80>_>::emplace_back<z80>(pvVar1,&local_2228);
        z80::~z80(&local_2228);
        Operand::~Operand(&local_22a0);
        Operand::~Operand(&local_2250);
        Operand::~Operand(&local_2278);
      }
      else {
        Operand::Operand(&local_2310,o2);
        translateRegister(&local_22e8,&local_2310);
        std::operator+(&local_22c0,"Attempt to xor a register other than a!",&local_22e8.value);
        log((double)CONCAT44(extraout_XMM0_Db,extraout_XMM0_Da));
        std::__cxx11::string::~string((string *)&local_22c0);
        Operand::~Operand(&local_22e8);
        Operand::~Operand(&local_2310);
      }
    }
    else {
      Operand::Operand(&local_2400,o2);
      translateValue(&local_23d8,&local_2400);
      Operand::Operand(&local_2450,o1);
      translateValue(&local_2428,&local_2450);
      z80::z80(&local_23b0,_xor,&local_23d8,&local_2428);
      std::vector<z80,_std::allocator<z80>_>::emplace_back<z80>(pvVar1,&local_23b0);
      z80::~z80(&local_23b0);
      Operand::~Operand(&local_2428);
      Operand::~Operand(&local_2450);
      Operand::~Operand(&local_23d8);
      Operand::~Operand(&local_2400);
    }
    break;
  case ret:
  case retl:
    local_29f4[2] = 2;
    std::vector<z80,_std::allocator<z80>_>::emplace_back<z80::OpCode>(instructions,local_29f4 + 2);
    break;
  case movb:
  case movl:
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_2598,"(%esp)",&local_2599);
    literal(&local_2578,&local_2598);
    bVar3 = Operand::operator==(o2,&local_2578);
    Operand::~Operand(&local_2578);
    std::__cxx11::string::~string((string *)&local_2598);
    std::allocator<char>::~allocator(&local_2599);
    pvVar2 = pvStack_10;
    if (bVar3) {
      local_25a0 = ld;
      Operand::Operand(&local_25f0,o1);
      translateValue(&local_25c8,&local_25f0);
      std::vector<z80,std::allocator<z80>>::emplace_back<z80::OpCode,Operand&,Operand>
                (pvVar2,&local_25a0,&registers.iyl,&local_25c8);
      Operand::~Operand(&local_25c8);
      Operand::~Operand(&local_25f0);
      pvVar2 = pvStack_10;
      local_25f4 = ld;
      literal(&local_2620,0);
      std::vector<z80,std::allocator<z80>>::emplace_back<z80::OpCode,Operand&,Operand>
                (pvVar2,&local_25f4,&registers.iyh,&local_2620);
      Operand::~Operand(&local_2620);
      pvVar2 = pvStack_10;
      local_2624 = ex;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_2670,"(sp)",&local_2671);
      literal(&local_2650,&local_2670);
      std::vector<z80,std::allocator<z80>>::emplace_back<z80::OpCode,Operand,Operand&>
                (pvVar2,&local_2624,&local_2650,&registers.iy);
      Operand::~Operand(&local_2650);
      std::__cxx11::string::~string((string *)&local_2670);
      std::allocator<char>::~allocator(&local_2671);
    }
    else {
      Operand::Operand(&local_26a0,reg,0x10);
      bVar3 = Operand::operator!=(o1,&local_26a0);
      Operand::~Operand(&local_26a0);
      pvVar2 = pvStack_10;
      if (bVar3) {
        Operand::Operand(&local_2768,&registers.a);
        Operand::Operand(&local_27b8,o1);
        translateLiteral(&local_2790,&local_27b8);
        z80::z80(&local_2740,ld,&local_2768,&local_2790);
        std::vector<z80,_std::allocator<z80>_>::emplace_back<z80>
                  ((vector<z80,_std::allocator<z80>_> *)pvVar2,&local_2740);
        z80::~z80(&local_2740);
        Operand::~Operand(&local_2790);
        Operand::~Operand(&local_27b8);
        Operand::~Operand(&local_2768);
      }
      Operand::Operand(&local_27e0,reg,0x10);
      bVar3 = Operand::operator!=(o2,&local_27e0);
      Operand::~Operand(&local_27e0);
      pvVar2 = pvStack_10;
      if (bVar3) {
        Operand::Operand(&local_28d0,o2);
        translateAddress(&local_28a8,&local_28d0);
        Operand::Operand(&local_28f8,&registers.a);
        z80::z80(&local_2880,ld,&local_28a8,&local_28f8);
        std::vector<z80,_std::allocator<z80>_>::emplace_back<z80>
                  ((vector<z80,_std::allocator<z80>_> *)pvVar2,&local_2880);
        z80::~z80(&local_2880);
        Operand::~Operand(&local_28f8);
        Operand::~Operand(&local_28a8);
        Operand::~Operand(&local_28d0);
      }
    }
    break;
  case movw:
    local_24ac = ld;
    Operand::Operand(&local_2500,o2);
    translateAddress(&local_24d8,&local_2500);
    Operand::Operand(&local_2550,o1);
    translateValue(&local_2528,&local_2550);
    std::vector<z80,std::allocator<z80>>::emplace_back<z80::OpCode,Operand,Operand>
              ((vector<z80,std::allocator<z80>> *)instructions,&local_24ac,&local_24d8,&local_2528);
    Operand::~Operand(&local_2528);
    Operand::~Operand(&local_2550);
    Operand::~Operand(&local_24d8);
    Operand::~Operand(&local_2500);
    break;
  case jne:
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_16a0,"nz",&local_16a1);
    literal(&local_1680,&local_16a0);
    Operand::Operand(&local_16f8,o1);
    translateLiteral(&local_16d0,&local_16f8);
    z80::z80(&local_1658,jp,&local_1680,&local_16d0);
    std::vector<z80,_std::allocator<z80>_>::emplace_back<z80>(instructions,&local_1658);
    z80::~z80(&local_1658);
    Operand::~Operand(&local_16d0);
    Operand::~Operand(&local_16f8);
    Operand::~Operand(&local_1680);
    std::__cxx11::string::~string((string *)&local_16a0);
    std::allocator<char>::~allocator(&local_16a1);
    break;
  case incl:
    Operand::Operand(&local_1498,o1);
    translateValue(&local_1470,&local_1498);
    local_14c8.value._M_string_length = 0;
    local_14c8.value.field_2._M_allocated_capacity = 0;
    local_14c8.type = empty;
    local_14c8.reg_num = 0;
    local_14c8.value._M_dataplus = (_Alloc_hider)0x0;
    local_14c8.value._1_7_ = 0;
    local_14c8.value.field_2._8_8_ = 0;
    Operand::Operand(&local_14c8);
    z80::z80(&local_1448,inc,&local_1470,&local_14c8);
    std::vector<z80,_std::allocator<z80>_>::emplace_back<z80>(instructions,&local_1448);
    z80::~z80(&local_1448);
    Operand::~Operand(&local_14c8);
    Operand::~Operand(&local_1470);
    Operand::~Operand(&local_1498);
    pvVar1 = (vector<z80,_std::allocator<z80>_> *)pvStack_10;
    literal(&local_1590,0);
    local_15b8.value._M_string_length = 0;
    local_15b8.value.field_2._M_allocated_capacity = 0;
    local_15b8.type = empty;
    local_15b8.reg_num = 0;
    local_15b8.value._M_dataplus = (_Alloc_hider)0x0;
    local_15b8.value._1_7_ = 0;
    local_15b8.value.field_2._8_8_ = 0;
    Operand::Operand(&local_15b8);
    z80::z80(&local_1568,cp,&local_1590,&local_15b8);
    std::vector<z80,_std::allocator<z80>_>::emplace_back<z80>(pvVar1,&local_1568);
    z80::~z80(&local_1568);
    Operand::~Operand(&local_15b8);
    Operand::~Operand(&local_1590);
    break;
  case decl:
    Operand::Operand(&local_1290,o1);
    translateValue(&local_1268,&local_1290);
    local_12b8.value._M_string_length = 0;
    local_12b8.value.field_2._M_allocated_capacity = 0;
    local_12b8.type = empty;
    local_12b8.reg_num = 0;
    local_12b8.value._M_dataplus = (_Alloc_hider)0x0;
    local_12b8.value._1_7_ = 0;
    local_12b8.value.field_2._8_8_ = 0;
    Operand::Operand(&local_12b8);
    z80::z80(&local_1240,dec,&local_1268,&local_12b8);
    std::vector<z80,_std::allocator<z80>_>::emplace_back<z80>(instructions,&local_1240);
    z80::~z80(&local_1240);
    Operand::~Operand(&local_12b8);
    Operand::~Operand(&local_1268);
    Operand::~Operand(&local_1290);
    pvVar1 = (vector<z80,_std::allocator<z80>_> *)pvStack_10;
    literal(&local_1380,0);
    local_13a8.value._M_string_length = 0;
    local_13a8.value.field_2._M_allocated_capacity = 0;
    local_13a8.type = empty;
    local_13a8.reg_num = 0;
    local_13a8.value._M_dataplus = (_Alloc_hider)0x0;
    local_13a8.value._1_7_ = 0;
    local_13a8.value.field_2._8_8_ = 0;
    Operand::Operand(&local_13a8);
    z80::z80(&local_1358,cp,&local_1380,&local_13a8);
    std::vector<z80,_std::allocator<z80>_>::emplace_back<z80>(pvVar1,&local_1358);
    z80::~z80(&local_1358);
    Operand::~Operand(&local_13a8);
    Operand::~Operand(&local_1380);
    break;
  case addl:
    Operand::Operand(&local_1c18,o2);
    translateValue(&local_1bf0,&local_1c18);
    bVar3 = Operand::operator==(&local_1bf0,&registers.sp);
    Operand::~Operand(&local_1bf0);
    Operand::~Operand(&local_1c18);
    pvVar1 = (vector<z80,_std::allocator<z80>_> *)pvStack_10;
    if (bVar3) {
      Operand::Operand(&local_1ce0,&registers.ix);
      Operand::Operand(&local_1d78,o1);
      translateLiteral(&local_1d50,&local_1d78);
      std::__cxx11::string::string((string *)&local_1d28,(string *)&local_1d50.value);
      literal(&local_1d08,&local_1d28);
      z80::z80(&local_1cb8,ld,&local_1ce0,&local_1d08);
      std::vector<z80,_std::allocator<z80>_>::emplace_back<z80>(pvVar1,&local_1cb8);
      z80::~z80(&local_1cb8);
      Operand::~Operand(&local_1d08);
      std::__cxx11::string::~string((string *)&local_1d28);
      Operand::~Operand(&local_1d50);
      Operand::~Operand(&local_1d78);
      Operand::~Operand(&local_1ce0);
      pvVar1 = (vector<z80,_std::allocator<z80>_> *)pvStack_10;
      Operand::Operand(&local_1e40,&registers.ix);
      Operand::Operand(&local_1e68,&registers.sp);
      z80::z80(&local_1e18,add,&local_1e40,&local_1e68);
      std::vector<z80,_std::allocator<z80>_>::emplace_back<z80>(pvVar1,&local_1e18);
      z80::~z80(&local_1e18);
      Operand::~Operand(&local_1e68);
      Operand::~Operand(&local_1e40);
      pvVar1 = (vector<z80,_std::allocator<z80>_> *)pvStack_10;
      Operand::Operand(&local_1f30,&registers.sp);
      Operand::Operand(&local_1f58,&registers.ix);
      z80::z80(&local_1f08,ld,&local_1f30,&local_1f58);
      std::vector<z80,_std::allocator<z80>_>::emplace_back<z80>(pvVar1,&local_1f08);
      z80::~z80(&local_1f08);
      Operand::~Operand(&local_1f58);
      Operand::~Operand(&local_1f30);
    }
    else {
      Operand::Operand(&local_2048,o2);
      translateValue(&local_2020,&local_2048);
      Operand::Operand(&local_2098,o1);
      translateLiteral(&local_2070,&local_2098);
      z80::z80(&local_1ff8,add,&local_2020,&local_2070);
      std::vector<z80,_std::allocator<z80>_>::emplace_back<z80>(pvVar1,&local_1ff8);
      z80::~z80(&local_1ff8);
      Operand::~Operand(&local_2070);
      Operand::~Operand(&local_2098);
      Operand::~Operand(&local_2020);
      Operand::~Operand(&local_2048);
    }
    break;
  case subl:
    Operand::Operand(&local_1748,o2);
    translateValue(&local_1720,&local_1748);
    bVar3 = Operand::operator==(&local_1720,&registers.sp);
    Operand::~Operand(&local_1720);
    Operand::~Operand(&local_1748);
    pvVar1 = (vector<z80,_std::allocator<z80>_> *)pvStack_10;
    if (bVar3) {
      Operand::Operand(&local_1810,&registers.ix);
      Operand::Operand(&local_18a8,o1);
      translateLiteral(&local_1880,&local_18a8);
      std::operator+(&local_1858,"-",&local_1880.value);
      literal(&local_1838,&local_1858);
      z80::z80(&local_17e8,ld,&local_1810,&local_1838);
      std::vector<z80,_std::allocator<z80>_>::emplace_back<z80>(pvVar1,&local_17e8);
      z80::~z80(&local_17e8);
      Operand::~Operand(&local_1838);
      std::__cxx11::string::~string((string *)&local_1858);
      Operand::~Operand(&local_1880);
      Operand::~Operand(&local_18a8);
      Operand::~Operand(&local_1810);
      pvVar1 = (vector<z80,_std::allocator<z80>_> *)pvStack_10;
      Operand::Operand(&local_1970,&registers.ix);
      Operand::Operand(&local_1998,&registers.sp);
      z80::z80(&local_1948,add,&local_1970,&local_1998);
      std::vector<z80,_std::allocator<z80>_>::emplace_back<z80>(pvVar1,&local_1948);
      z80::~z80(&local_1948);
      Operand::~Operand(&local_1998);
      Operand::~Operand(&local_1970);
      pvVar1 = (vector<z80,_std::allocator<z80>_> *)pvStack_10;
      Operand::Operand(&local_1a60,&registers.sp);
      Operand::Operand(&local_1a88,&registers.ix);
      z80::z80(&local_1a38,ld,&local_1a60,&local_1a88);
      std::vector<z80,_std::allocator<z80>_>::emplace_back<z80>(pvVar1,&local_1a38);
      z80::~z80(&local_1a38);
      Operand::~Operand(&local_1a88);
      Operand::~Operand(&local_1a60);
    }
    else {
      Operand::Operand(&local_1b78,o2);
      translateValue(&local_1b50,&local_1b78);
      Operand::Operand(&local_1bc8,o1);
      translateLiteral(&local_1ba0,&local_1bc8);
      z80::z80(&local_1b28,sub,&local_1b50,&local_1ba0);
      std::vector<z80,_std::allocator<z80>_>::emplace_back<z80>(pvVar1,&local_1b28);
      z80::~z80(&local_1b28);
      Operand::~Operand(&local_1ba0);
      Operand::~Operand(&local_1bc8);
      Operand::~Operand(&local_1b50);
      Operand::~Operand(&local_1b78);
    }
    break;
  case pushl:
    Operand::Operand(&local_78,o1);
    translateValue(&local_50,&local_78);
    bVar3 = Operand::operator==(&local_50,&registers.a);
    Operand::~Operand(&local_50);
    Operand::~Operand(&local_78);
    pvVar1 = (vector<z80,_std::allocator<z80>_> *)pvStack_10;
    if (bVar3) {
      Operand::Operand(&local_150,&registers.iyh);
      Operand::Operand(&local_178,&registers.a);
      z80::z80(&local_128,ld,&local_150,&local_178);
      std::vector<z80,_std::allocator<z80>_>::emplace_back<z80>(pvVar1,&local_128);
      z80::~z80(&local_128);
      Operand::~Operand(&local_178);
      Operand::~Operand(&local_150);
      pvVar1 = (vector<z80,_std::allocator<z80>_> *)pvStack_10;
      Operand::Operand(&local_240,&registers.iyl);
      literal(&local_268,0);
      z80::z80(&local_218,ld,&local_240,&local_268);
      std::vector<z80,_std::allocator<z80>_>::emplace_back<z80>(pvVar1,&local_218);
      z80::~z80(&local_218);
      Operand::~Operand(&local_268);
      Operand::~Operand(&local_240);
      pvVar1 = (vector<z80,_std::allocator<z80>_> *)pvStack_10;
      Operand::Operand(&local_330,&registers.iy);
      local_358.value._M_string_length = 0;
      local_358.value.field_2._M_allocated_capacity = 0;
      local_358.type = empty;
      local_358.reg_num = 0;
      local_358.value._M_dataplus = (_Alloc_hider)0x0;
      local_358.value._1_7_ = 0;
      local_358.value.field_2._8_8_ = 0;
      Operand::Operand(&local_358);
      z80::z80(&local_308,push,&local_330,&local_358);
      std::vector<z80,_std::allocator<z80>_>::emplace_back<z80>(pvVar1,&local_308);
      z80::~z80(&local_308);
      Operand::~Operand(&local_358);
      Operand::~Operand(&local_330);
    }
    else {
      Operand::Operand(&local_3a8,o1);
      local_3f9 = 0;
      local_3fa = 0;
      local_451 = 0;
      local_452 = 0;
      translateValue(&local_380,&local_3a8);
      bVar3 = Operand::operator==(&local_380,&registers.de);
      local_2a52 = true;
      if (!bVar3) {
        Operand::Operand(&local_3f8,o1);
        local_3f9 = 1;
        translateValue(&local_3d0,&local_3f8);
        local_3fa = 1;
        bVar3 = Operand::operator==(&local_3d0,&registers.bc);
        local_2a52 = true;
        if (!bVar3) {
          Operand::Operand(&local_450,o1);
          local_451 = 1;
          translateValue(&local_428,&local_450);
          local_452 = 1;
          local_2a52 = Operand::operator==(&local_428,&registers.hl);
        }
      }
      if ((local_452 & 1) != 0) {
        Operand::~Operand(&local_428);
      }
      if ((local_451 & 1) != 0) {
        Operand::~Operand(&local_450);
      }
      if ((local_3fa & 1) != 0) {
        Operand::~Operand(&local_3d0);
      }
      if ((local_3f9 & 1) != 0) {
        Operand::~Operand(&local_3f8);
      }
      Operand::~Operand(&local_380);
      Operand::~Operand(&local_3a8);
      pvVar1 = (vector<z80,_std::allocator<z80>_> *)pvStack_10;
      if (local_2a52 == false) {
        Operand::Operand(&local_640,&registers.iy);
        Operand::Operand(&local_690,o1);
        translateValue(&local_668,&local_690);
        z80::z80(&local_618,ld,&local_640,&local_668);
        std::vector<z80,_std::allocator<z80>_>::emplace_back<z80>(pvVar1,&local_618);
        z80::~z80(&local_618);
        Operand::~Operand(&local_668);
        Operand::~Operand(&local_690);
        Operand::~Operand(&local_640);
        pvVar1 = (vector<z80,_std::allocator<z80>_> *)pvStack_10;
        Operand::Operand(&local_758,&registers.iy);
        local_788.value._M_string_length = 0;
        local_788.value.field_2._M_allocated_capacity = 0;
        local_788.type = empty;
        local_788.reg_num = 0;
        local_788.value._M_dataplus = (_Alloc_hider)0x0;
        local_788.value._1_7_ = 0;
        local_788.value.field_2._8_8_ = 0;
        Operand::Operand(&local_788);
        z80::z80(&local_730,push,&local_758,&local_788);
        std::vector<z80,_std::allocator<z80>_>::emplace_back<z80>(pvVar1,&local_730);
        z80::~z80(&local_730);
        Operand::~Operand(&local_788);
        Operand::~Operand(&local_758);
      }
      else {
        Operand::Operand(&local_548,o1);
        translateValue(&local_520,&local_548);
        local_578.value._M_string_length = 0;
        local_578.value.field_2._M_allocated_capacity = 0;
        local_578.type = empty;
        local_578.reg_num = 0;
        local_578.value._M_dataplus = (_Alloc_hider)0x0;
        local_578.value._1_7_ = 0;
        local_578.value.field_2._8_8_ = 0;
        Operand::Operand(&local_578);
        z80::z80(&local_4f8,push,&local_520,&local_578);
        std::vector<z80,_std::allocator<z80>_>::emplace_back<z80>(pvVar1,&local_4f8);
        z80::~z80(&local_4f8);
        Operand::~Operand(&local_578);
        Operand::~Operand(&local_520);
        Operand::~Operand(&local_548);
      }
    }
    pvVar1 = (vector<z80,_std::allocator<z80>_> *)pvStack_10;
    Operand::Operand(&local_850,&registers.sp);
    local_878.value._M_string_length = 0;
    local_878.value.field_2._M_allocated_capacity = 0;
    local_878.type = empty;
    local_878.reg_num = 0;
    local_878.value._M_dataplus = (_Alloc_hider)0x0;
    local_878.value._1_7_ = 0;
    local_878.value.field_2._8_8_ = 0;
    Operand::Operand(&local_878);
    z80::z80(&local_828,inc,&local_850,&local_878);
    std::vector<z80,_std::allocator<z80>_>::emplace_back<z80>(pvVar1,&local_828);
    z80::~z80(&local_828);
    Operand::~Operand(&local_878);
    Operand::~Operand(&local_850);
    pvVar1 = (vector<z80,_std::allocator<z80>_> *)pvStack_10;
    Operand::Operand(&local_940,&registers.ix);
    local_968.value._M_string_length = 0;
    local_968.value.field_2._M_allocated_capacity = 0;
    local_968.type = empty;
    local_968.reg_num = 0;
    local_968.value._M_dataplus = (_Alloc_hider)0x0;
    local_968.value._1_7_ = 0;
    local_968.value.field_2._8_8_ = 0;
    Operand::Operand(&local_968);
    z80::z80(&local_918,dec,&local_940,&local_968);
    std::vector<z80,_std::allocator<z80>_>::emplace_back<z80>(pvVar1,&local_918);
    z80::~z80(&local_918);
    Operand::~Operand(&local_968);
    Operand::~Operand(&local_940);
    break;
  case popl:
    Operand::Operand(&local_a30,&registers.sp);
    local_a58.value._M_string_length = 0;
    local_a58.value.field_2._M_allocated_capacity = 0;
    local_a58.type = empty;
    local_a58.reg_num = 0;
    local_a58.value._M_dataplus = (_Alloc_hider)0x0;
    local_a58.value._1_7_ = 0;
    local_a58.value.field_2._8_8_ = 0;
    Operand::Operand(&local_a58);
    z80::z80(&local_a08,dec,&local_a30,&local_a58);
    std::vector<z80,_std::allocator<z80>_>::emplace_back<z80>(instructions,&local_a08);
    z80::~z80(&local_a08);
    Operand::~Operand(&local_a58);
    Operand::~Operand(&local_a30);
    pvVar1 = (vector<z80,_std::allocator<z80>_> *)pvStack_10;
    Operand::Operand(&local_b20,&registers.ix);
    local_b48.value._M_string_length = 0;
    local_b48.value.field_2._M_allocated_capacity = 0;
    local_b48.type = empty;
    local_b48.reg_num = 0;
    local_b48.value._M_dataplus = (_Alloc_hider)0x0;
    local_b48.value._1_7_ = 0;
    local_b48.value.field_2._8_8_ = 0;
    Operand::Operand(&local_b48);
    z80::z80(&local_af8,inc,&local_b20,&local_b48);
    std::vector<z80,_std::allocator<z80>_>::emplace_back<z80>(pvVar1,&local_af8);
    z80::~z80(&local_af8);
    Operand::~Operand(&local_b48);
    Operand::~Operand(&local_b20);
    Operand::Operand(&local_b98,o1);
    translateValue(&local_b70,&local_b98);
    bVar3 = Operand::operator==(&local_b70,&registers.a);
    Operand::~Operand(&local_b70);
    Operand::~Operand(&local_b98);
    pvVar1 = (vector<z80,_std::allocator<z80>_> *)pvStack_10;
    if (bVar3) {
      Operand::Operand(&local_c60,&registers.iy);
      local_c88.value._M_string_length = 0;
      local_c88.value.field_2._M_allocated_capacity = 0;
      local_c88.type = empty;
      local_c88.reg_num = 0;
      local_c88.value._M_dataplus = (_Alloc_hider)0x0;
      local_c88.value._1_7_ = 0;
      local_c88.value.field_2._8_8_ = 0;
      Operand::Operand(&local_c88);
      z80::z80(&local_c38,pop,&local_c60,&local_c88);
      std::vector<z80,_std::allocator<z80>_>::emplace_back<z80>(pvVar1,&local_c38);
      z80::~z80(&local_c38);
      Operand::~Operand(&local_c88);
      Operand::~Operand(&local_c60);
      pvVar1 = (vector<z80,_std::allocator<z80>_> *)pvStack_10;
      Operand::Operand(&local_d50,&registers.a);
      Operand::Operand(&local_d78,&registers.iyh);
      z80::z80(&local_d28,ld,&local_d50,&local_d78);
      std::vector<z80,_std::allocator<z80>_>::emplace_back<z80>(pvVar1,&local_d28);
      z80::~z80(&local_d28);
      Operand::~Operand(&local_d78);
      Operand::~Operand(&local_d50);
    }
    else {
      Operand::Operand(&local_dc8,o1);
      local_e19 = 0;
      local_e1a = 0;
      local_e71 = 0;
      local_e72 = 0;
      translateValue(&local_da0,&local_dc8);
      bVar3 = Operand::operator==(&local_da0,&registers.de);
      local_2b2a = true;
      if (!bVar3) {
        Operand::Operand(&local_e18,o1);
        local_e19 = 1;
        translateValue(&local_df0,&local_e18);
        local_e1a = 1;
        bVar3 = Operand::operator==(&local_df0,&registers.bc);
        local_2b2a = true;
        if (!bVar3) {
          Operand::Operand(&local_e70,o1);
          local_e71 = 1;
          translateValue(&local_e48,&local_e70);
          local_e72 = 1;
          local_2b2a = Operand::operator==(&local_e48,&registers.hl);
        }
      }
      if ((local_e72 & 1) != 0) {
        Operand::~Operand(&local_e48);
      }
      if ((local_e71 & 1) != 0) {
        Operand::~Operand(&local_e70);
      }
      if ((local_e1a & 1) != 0) {
        Operand::~Operand(&local_df0);
      }
      if ((local_e19 & 1) != 0) {
        Operand::~Operand(&local_e18);
      }
      Operand::~Operand(&local_da0);
      Operand::~Operand(&local_dc8);
      pvVar1 = (vector<z80,_std::allocator<z80>_> *)pvStack_10;
      if (local_2b2a == false) {
        Operand::Operand(&local_1060,&registers.iy);
        local_1088.value._M_string_length = 0;
        local_1088.value.field_2._M_allocated_capacity = 0;
        local_1088.type = empty;
        local_1088.reg_num = 0;
        local_1088.value._M_dataplus = (_Alloc_hider)0x0;
        local_1088.value._1_7_ = 0;
        local_1088.value.field_2._8_8_ = 0;
        Operand::Operand(&local_1088);
        z80::z80(&local_1038,pop,&local_1060,&local_1088);
        std::vector<z80,_std::allocator<z80>_>::emplace_back<z80>(pvVar1,&local_1038);
        z80::~z80(&local_1038);
        Operand::~Operand(&local_1088);
        Operand::~Operand(&local_1060);
        pvVar1 = (vector<z80,_std::allocator<z80>_> *)pvStack_10;
        Operand::Operand(&local_1178,o1);
        translateValue(&local_1150,&local_1178);
        Operand::Operand(&local_11a0,&registers.iy);
        z80::z80(&local_1128,ld,&local_1150,&local_11a0);
        std::vector<z80,_std::allocator<z80>_>::emplace_back<z80>(pvVar1,&local_1128);
        z80::~z80(&local_1128);
        Operand::~Operand(&local_11a0);
        Operand::~Operand(&local_1150);
        Operand::~Operand(&local_1178);
      }
      else {
        Operand::Operand(&local_f68,o1);
        translateValue(&local_f40,&local_f68);
        local_f98.value._M_string_length = 0;
        local_f98.value.field_2._M_allocated_capacity = 0;
        local_f98.type = empty;
        local_f98.reg_num = 0;
        local_f98.value._M_dataplus = (_Alloc_hider)0x0;
        local_f98.value._1_7_ = 0;
        local_f98.value.field_2._8_8_ = 0;
        Operand::Operand(&local_f98);
        z80::z80(&local_f18,pop,&local_f40,&local_f98);
        std::vector<z80,_std::allocator<z80>_>::emplace_back<z80>(pvVar1,&local_f18);
        z80::~z80(&local_f18);
        Operand::~Operand(&local_f98);
        Operand::~Operand(&local_f40);
        Operand::~Operand(&local_f68);
      }
    }
    break;
  case calll:
  case callw:
    Operand::Operand(&local_29c0,o1);
    Operand::Operand(&local_29e8,o2);
    z80::z80(&local_2998,call,&local_29c0,&local_29e8);
    std::vector<z80,_std::allocator<z80>_>::emplace_back<z80>(instructions,&local_2998);
    z80::~z80(&local_2998);
    Operand::~Operand(&local_29e8);
    Operand::~Operand(&local_29c0);
  }
  return;
}

Assistant:

void translate_instruction(std::vector<z80>& instructions, const i386::OpCode op, const Operand o1, const Operand o2) {
	switch (op) {
		case i386::OpCode::pushl:
			if (translateValue(o1) == registers.a) {
				instructions.emplace_back(z80(z80::OpCode::ld, registers.iyh, registers.a));
				instructions.emplace_back(z80(z80::OpCode::ld, registers.iyl, literal(0)));
				instructions.emplace_back(z80(z80::OpCode::push, registers.iy, Operand()));
			}
			else if(translateValue(o1) == registers.de || translateValue(o1) == registers.bc || translateValue(o1) == registers.hl) {
				instructions.emplace_back(z80(z80::OpCode::push, translateValue(o1), Operand()));
			}
			else {
				instructions.emplace_back(z80(z80::OpCode::ld, registers.iy, translateValue(o1)));
				instructions.emplace_back(z80(z80::OpCode::push, registers.iy, Operand()));
			}
			instructions.emplace_back(z80(z80::OpCode::inc, registers.sp, Operand()));
			instructions.emplace_back(z80(z80::OpCode::dec, registers.ix, Operand()));
			break;
		case i386::OpCode::popl:
			instructions.emplace_back(z80(z80::OpCode::dec, registers.sp, Operand()));
			instructions.emplace_back(z80(z80::OpCode::inc, registers.ix, Operand()));
			if (translateValue(o1) == registers.a) {
				instructions.emplace_back(z80(z80::OpCode::pop, registers.iy, Operand()));
				instructions.emplace_back(z80(z80::OpCode::ld, registers.a, registers.iyh));
			}
			else if(translateValue(o1) == registers.de || translateValue(o1) == registers.bc || translateValue(o1) == registers.hl) {
				instructions.emplace_back(z80(z80::OpCode::pop, translateValue(o1), Operand()));
			}
			else {
				instructions.emplace_back(z80(z80::OpCode::pop, registers.iy, Operand()));
				instructions.emplace_back(z80(z80::OpCode::ld, translateValue(o1),registers.iy));
			}
			break;
		case i386::OpCode::decl:
			instructions.emplace_back(z80(z80::OpCode::dec, translateValue(o1), Operand()));
			instructions.emplace_back(z80(z80::OpCode::cp, literal(0), Operand()));
			break;
		case i386::OpCode::incl:
			instructions.emplace_back(z80(z80::OpCode::inc, translateValue(o1), Operand()));
			instructions.emplace_back(z80(z80::OpCode::cp, literal(0), Operand()));
			break;
		case i386::OpCode::jne:
			instructions.emplace_back(z80(z80::OpCode::jp, literal("nz"), translateLiteral(o1)));
			break;
		case i386::OpCode::subl:
			if (translateValue(o2) == registers.sp) {
				instructions.emplace_back(z80(z80::OpCode::ld, registers.ix, literal("-" + translateLiteral(o1).value)));
				instructions.emplace_back(z80(z80::OpCode::add, registers.ix, registers.sp));
				instructions.emplace_back(z80(z80::OpCode::ld, registers.sp, registers.ix));
			}
			else {
				instructions.emplace_back(z80(z80::OpCode::sub, translateValue(o2), translateLiteral(o1)));
			}
			break;
		case i386::OpCode::addl:
			if (translateValue(o2) == registers.sp) {
				instructions.emplace_back(z80(z80::OpCode::ld, registers.ix, literal(translateLiteral(o1).value)));
				instructions.emplace_back(z80(z80::OpCode::add, registers.ix, registers.sp));
				instructions.emplace_back(z80(z80::OpCode::ld, registers.sp, registers.ix));
			}
			else {
				instructions.emplace_back(z80(z80::OpCode::add, translateValue(o2), translateLiteral(o1)));
			}
			break;
		case i386::OpCode::xorl:
			if (translateRegister(o2) != registers.a) {
				if (translateRegister(o2) == translateRegister(o1)) {
					// Clear the register
					instructions.emplace_back(z80(z80::OpCode::ld, translateRegister(o1),literal(0)));
				}
				else {
					log(LogLevel::Error, "Attempt to xor a register other than a!" + translateRegister(o2).value);
				}
			}
			else {
				instructions.emplace_back(z80(z80::OpCode::_xor, translateValue(o2), translateValue(o1)));
			}
			break;
		case i386::OpCode::movzwl:
			instructions.emplace_back(z80::OpCode::ld, registers.iy, translateLiteral(o1));
			break;
		case i386::OpCode::movw:
			instructions.emplace_back(z80::OpCode::ld, translateAddress(o2), translateValue(o1));
			break;
		case i386::OpCode::movl:
		case i386::OpCode::movb:
			if (o2 == literal("(%esp)")) {
				instructions.emplace_back(z80::OpCode::ld, registers.iyl, translateValue(o1));
				instructions.emplace_back(z80::OpCode::ld, registers.iyh, literal(0));
				instructions.emplace_back(z80::OpCode::ex, literal("(sp)"), registers.iy);
			}
			else {
				if (o1 != Operand(Operand::Type::reg, 0x10)) {
					instructions.emplace_back(z80(z80::OpCode::ld, registers.a, translateLiteral(o1)));
				}
				if (o2 != Operand(Operand::Type::reg, 0x10)) {
					instructions.emplace_back(z80(z80::OpCode::ld, translateAddress(o2), registers.a));
				}
			}
			break;
		case i386::OpCode::calll:
		case i386::OpCode::callw:
			instructions.emplace_back(z80(z80::OpCode::call, o1, o2));
			break;
		case i386::OpCode::ret:
		case i386::OpCode::retl:
			instructions.emplace_back(z80::OpCode::ret);
			break;
		case i386::OpCode::hlt:
			instructions.emplace_back(z80::OpCode::halt);
			break;
		default:
			instructions.emplace_back(z80::OpCode::unknown);
			break;
	}
}